

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizeImage.cpp
# Opt level: O2

void resizeCube(EnvmapImage *image1,EnvmapImage *image2,Box2i *image2DataWindow,float filterRadius,
               int numSamples)

{
  Rgba *__dest;
  bool bVar1;
  Envmap EVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Box2i *this;
  Array2D<Imf_3_2::Rgba> *pAVar6;
  Rgba RVar7;
  int x;
  int iVar8;
  uint uVar9;
  V2f posInFace;
  V2f pos;
  V3f local_58;
  undefined8 local_48;
  V3f dir;
  
  EVar2 = EnvmapImage::type(image1);
  if (EVar2 == ENVMAP_CUBE) {
    this = EnvmapImage::dataWindow(image1);
    bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(this,image2DataWindow);
    if (bVar1) {
      EnvmapImage::resize(image2,ENVMAP_CUBE,image2DataWindow);
      iVar4 = (image2DataWindow->max).x;
      iVar3 = (image2DataWindow->max).y;
      iVar5 = (image2DataWindow->min).x;
      iVar8 = (image2DataWindow->min).y;
      pAVar6 = EnvmapImage::pixels(image2);
      __dest = pAVar6->_data;
      pAVar6 = EnvmapImage::pixels(image1);
      memcpy(__dest,pAVar6->_data,(long)((iVar3 - iVar8) + 1) * (long)((iVar4 - iVar5) + 1) * 8);
      return;
    }
  }
  iVar3 = Imf_3_2::CubeMap::sizeOfFace((Box *)image2DataWindow);
  EnvmapImage::resize(image2,ENVMAP_CUBE,image2DataWindow);
  EnvmapImage::clear(image2);
  pAVar6 = EnvmapImage::pixels(image2);
  uVar9 = 0;
  iVar4 = 0;
  if (0 < iVar3) {
    iVar4 = iVar3;
  }
  for (; uVar9 != 6; uVar9 = uVar9 + 1) {
    for (iVar5 = 0; iVar5 != iVar4; iVar5 = iVar5 + 1) {
      for (iVar8 = 0; iVar3 != iVar8; iVar8 = iVar8 + 1) {
        Imf_3_2::CubeMap::direction((CubeMapFace)&dir,(Box *)(ulong)uVar9,(Vec2 *)image2DataWindow);
        local_48 = CONCAT44((float)iVar5,(float)iVar8);
        Imf_3_2::CubeMap::pixelPosition(&pos,uVar9,image2DataWindow,&local_48);
        local_58.x = dir.x;
        local_58.y = dir.y;
        local_58.z = dir.z;
        RVar7 = EnvmapImage::filteredLookup
                          (image1,&local_58,(filterRadius * 1.5) / (float)iVar3,numSamples);
        pAVar6->_data[(long)(int)(pos.y + 0.5) * pAVar6->_sizeY + (long)(int)(pos.x + 0.5)] = RVar7;
      }
    }
  }
  return;
}

Assistant:

void
resizeCube (
    const EnvmapImage& image1,
    EnvmapImage&       image2,
    const Box2i&       image2DataWindow,
    float              filterRadius,
    int                numSamples)
{
    if (image1.type () == ENVMAP_CUBE &&
        image1.dataWindow () == image2DataWindow)
    {
        //
        // Special case - the input image is a cube-face environment
        // map with the same size as the output image.  We can copy
        // the input image without resampling.
        //

        image2.resize (ENVMAP_CUBE, image2DataWindow);

        int w = image2DataWindow.max.x - image2DataWindow.min.x + 1;
        int h = image2DataWindow.max.y - image2DataWindow.min.y + 1;

        memcpy (
            &(image2.pixels ()[0][0]),
            &(image1.pixels ()[0][0]),
            sizeof (Rgba) * w * h);

        return;
    }

    //
    // Resampe the input image
    //

    int   sof    = CubeMap::sizeOfFace (image2DataWindow);
    float radius = 1.5f * filterRadius / sof;

    image2.resize (ENVMAP_CUBE, image2DataWindow);
    image2.clear ();

    Array2D<Rgba>& pixels = image2.pixels ();

    for (int f = CUBEFACE_POS_X; f <= CUBEFACE_NEG_Z; ++f)
    {
        CubeMapFace face = CubeMapFace (f);

        for (int y = 0; y < sof; ++y)
        {
            for (int x = 0; x < sof; ++x)
            {
                V2f posInFace (x, y);

                V3f dir =
                    CubeMap::direction (face, image2DataWindow, posInFace);

                V2f pos =
                    CubeMap::pixelPosition (face, image2DataWindow, posInFace);

                pixels[int (pos.y + 0.5f)][int (pos.x + 0.5f)] =
                    image1.filteredLookup (dir, radius, numSamples);
            }
        }
    }
}